

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_lib.c
# Opt level: O0

int EVP_CIPHER_get_type(EVP_CIPHER *cipher)

{
  ASN1_OBJECT *a;
  uchar *puVar1;
  EVP_CIPHER *in_RDI;
  ASN1_OBJECT *otmp;
  int nid;
  int local_14;
  
  local_14 = EVP_CIPHER_get_nid(in_RDI);
  if (local_14 == 5) {
    return 5;
  }
  if (local_14 == 0x1e) {
    return 0x1e;
  }
  if (local_14 != 0x25) {
    if (local_14 == 0x3d) {
      return 0x1e;
    }
    if (local_14 == 0x61) {
      return 5;
    }
    if ((local_14 != 0x62) && (local_14 != 0xa6)) {
      if (local_14 == 0x1a5) {
        return 0x1a5;
      }
      if (local_14 == 0x1a9) {
        return 0x1a9;
      }
      if (local_14 != 0x1ad) {
        if (local_14 == 0x28a) {
          return 0x1a5;
        }
        if (local_14 == 0x28b) {
          return 0x1a9;
        }
        if (local_14 != 0x28c) {
          if (local_14 == 0x28d) {
            return 0x1a5;
          }
          if (local_14 == 0x28e) {
            return 0x1a9;
          }
          if (local_14 != 0x28f) {
            if (local_14 - 0x290U < 2) {
              return 0x1e;
            }
            if (local_14 - 0x292U < 2) {
              return 0x1e;
            }
            a = OBJ_nid2obj(local_14);
            puVar1 = OBJ_get0_data((ASN1_OBJECT *)a);
            if (puVar1 == (uchar *)0x0) {
              local_14 = 0;
            }
            ASN1_OBJECT_free(a);
            return local_14;
          }
        }
      }
      return 0x1ad;
    }
  }
  return 0x25;
}

Assistant:

int EVP_CIPHER_get_type(const EVP_CIPHER *cipher)
{
    int nid;
    nid = EVP_CIPHER_get_nid(cipher);

    switch (nid) {

    case NID_rc2_cbc:
    case NID_rc2_64_cbc:
    case NID_rc2_40_cbc:

        return NID_rc2_cbc;

    case NID_rc4:
    case NID_rc4_40:

        return NID_rc4;

    case NID_aes_128_cfb128:
    case NID_aes_128_cfb8:
    case NID_aes_128_cfb1:

        return NID_aes_128_cfb128;

    case NID_aes_192_cfb128:
    case NID_aes_192_cfb8:
    case NID_aes_192_cfb1:

        return NID_aes_192_cfb128;

    case NID_aes_256_cfb128:
    case NID_aes_256_cfb8:
    case NID_aes_256_cfb1:

        return NID_aes_256_cfb128;

    case NID_des_cfb64:
    case NID_des_cfb8:
    case NID_des_cfb1:

        return NID_des_cfb64;

    case NID_des_ede3_cfb64:
    case NID_des_ede3_cfb8:
    case NID_des_ede3_cfb1:

        return NID_des_cfb64;

    default:
#ifdef FIPS_MODULE
        return NID_undef;
#else
        {
            /* Check it has an OID and it is valid */
            ASN1_OBJECT *otmp = OBJ_nid2obj(nid);

            if (OBJ_get0_data(otmp) == NULL)
                nid = NID_undef;
            ASN1_OBJECT_free(otmp);
            return nid;
        }
#endif
    }
}